

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O2

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateAttribute
          (HtmlparserCppTest *this,string *expected_attr)

{
  bool bVar1;
  char *pcVar2;
  
  pcVar2 = HtmlParser::attribute(&this->parser_);
  if (pcVar2 == (char *)0x0) {
    fprintf(_stderr,"Check failed: %s\n","parser_.attribute() != __null");
  }
  else {
    pcVar2 = HtmlParser::attribute(&this->parser_);
    bVar1 = std::operator==(expected_attr,pcVar2);
    if (bVar1) {
      return;
    }
    fprintf(_stderr,"Check failed: %s %s %s\n","expected_attr","==","parser_.attribute()");
  }
  exit(1);
}

Assistant:

void HtmlparserCppTest::ValidateAttribute(const string &expected_attr) {
  EXPECT_TRUE(parser_.attribute() != NULL);
  EXPECT_EQ(expected_attr, parser_.attribute())
      << "Unexpected attr name value at line " << parser_.line_number();
}